

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O2

void __thiscall bandit::reporter::info::it_unknown_error(info *this,string *desc)

{
  int *piVar1;
  context_info *pcVar2;
  ostream *poVar3;
  _Elt_pointer pcVar4;
  stringstream ss;
  string local_200;
  string local_1e0 [32];
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  piVar1 = &(this->super_colored_base).super_progress_base.specs_failed_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::stringstream::stringstream(local_1a0);
  progress_base::current_context_name_abi_cxx11_(&local_200,(progress_base *)this);
  poVar3 = std::operator<<(local_190,(string *)&local_200);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,(string *)desc);
  poVar3 = std::operator<<(poVar3,": Unknown exception");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::stringbuf::str();
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->super_colored_base).super_progress_base.failures_,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  pcVar4 = (this->context_stack_).c.
           super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pcVar4 == (this->context_stack_).c.
                super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pcVar2 = (this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
    piVar1 = &pcVar2[9].total;
    *piVar1 = *piVar1 + 1;
    pcVar4 = pcVar2 + 10;
  }
  else {
    pcVar4[-1].total = pcVar4[-1].total + 1;
  }
  pcVar4[-1].failed = pcVar4[-1].failed + 1;
  this->indentation_ = this->indentation_ + -1;
  poVar3 = std::operator<<((this->super_colored_base).stm_,"\r");
  indent_abi_cxx11_(&local_200,this);
  poVar3 = std::operator<<(poVar3,(string *)&local_200);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(local_1c0);
  poVar3 = std::operator<<(poVar3,local_1c0);
  poVar3 = std::operator<<(poVar3,"-ERROR->");
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(local_1e0);
  poVar3 = std::operator<<(poVar3,local_1e0);
  poVar3 = std::operator<<(poVar3," it ");
  poVar3 = std::operator<<(poVar3,(string *)desc);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string((string *)&local_200);
  std::ostream::flush();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void it_unknown_error(const std::string& desc) override {
        ++specs_failed_;

        std::stringstream ss;
        ss << current_context_name() << " " << desc << ": Unknown exception" << std::endl;
        failures_.push_back(ss.str());

        ++context_stack_.top().total;
        ++context_stack_.top().failed;
        --indentation_;
        stm_
            << "\r" << indent()
            << colorizer_.bad()
            << "-ERROR->"
            << colorizer_.reset()
            << " it " << desc
            << std::endl;
        stm_.flush();
      }